

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int P_PushDown(AActor *thing,FChangePosition *cpos)

{
  double dVar1;
  int iVar2;
  AActor *thing_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if ((thing->__Pos).Z <= thing->floorz) {
    return 1;
  }
  iVar2 = thing->Mass;
  uVar5 = (ulong)intersectors.Count;
  P_FindBelowIntersectors(thing);
  uVar4 = (ulong)intersectors.Count;
  while( true ) {
    if (uVar4 <= uVar5) {
      AActor::CheckPortalTransition(thing,true);
      return 0;
    }
    thing_00 = intersectors.Array[uVar5];
    if ((((thing_00->flags2).Value & 0x1000) == 0) ||
       (((((thing_00->flags3).Value & 0x2000) == 0 && (iVar2 < thing_00->Mass)) ||
        (((thing_00->flags4).Value & 0x80) != 0)))) break;
    dVar1 = (thing_00->__Pos).Z;
    P_AdjustFloorCeil(thing_00,cpos);
    dVar6 = (thing->__Pos).Z - thing_00->Height;
    if (dVar6 < dVar1) {
      (thing_00->__Pos).Z = dVar6;
      iVar3 = P_PushDown(thing_00,cpos);
      if (iVar3 != 0) {
        P_DoCrunch(thing_00,cpos);
        (thing_00->__Pos).Z = dVar1;
        return 2;
      }
      AActor::UpdateRenderSectorList(thing_00);
    }
    uVar5 = uVar5 + 1;
  }
  return 2;
}

Assistant:

int P_PushDown(AActor *thing, FChangePosition *cpos)
{
	unsigned int firstintersect = intersectors.Size();
	unsigned int lastintersect;
	int mymass = thing->Mass;

	if (thing->Z() <= thing->floorz)
	{
		return 1;
	}
	P_FindBelowIntersectors(thing);
	lastintersect = intersectors.Size();
	for (; firstintersect < lastintersect; firstintersect++)
	{
		AActor *intersect = intersectors[firstintersect];
		if (!(intersect->flags2 & MF2_PASSMOBJ) ||
			(!(intersect->flags3 & MF3_ISMONSTER) && intersect->Mass > mymass) ||
			(intersect->flags4 & MF4_ACTLIKEBRIDGE)
			)
		{
			// Can't push bridges or things more massive than ourself
			return 2;
		}
		double oldz = intersect->Z();
		P_AdjustFloorCeil(intersect, cpos);
		if (oldz > thing->Z() - intersect->Height)
		{ // Only push things down, not up.
			intersect->SetZ(thing->Z() - intersect->Height);
			if (P_PushDown(intersect, cpos))
			{ // Move blocked
				P_DoCrunch(intersect, cpos);
				intersect->SetZ(oldz);
				return 2;
			}
			intersect->UpdateRenderSectorList();
		}
	}
	thing->CheckPortalTransition(true);
	return 0;
}